

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_interpolation_with_magic_number.cc
# Opt level: O2

bool __thiscall
sptk::InputSourceInterpolationWithMagicNumber::Get
          (InputSourceInterpolationWithMagicNumber *this,
          vector<double,_std::allocator<double>_> *buffer)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  ulong uVar4;
  int iVar5;
  size_t sVar6;
  bool bVar7;
  ulong uVar8;
  double dVar9;
  
  if (((buffer == (vector<double,_std::allocator<double>_> *)0x0) || (this->is_valid_ != true)) ||
     (this->remained_num_samples_ < 1)) {
    bVar7 = false;
  }
  else {
    if ((long)(buffer->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != (long)this->data_length_) {
      std::vector<double,_std::allocator<double>_>::resize(buffer,(long)this->data_length_);
    }
    pdVar2 = (this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = (long)(this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar2;
    if (sVar6 != 0) {
      memmove((buffer->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start,pdVar2,sVar6);
    }
    iVar5 = this->remained_num_samples_;
    this->remained_num_samples_ = iVar5 + -1;
    if (iVar5 < 2) {
      bVar7 = true;
      if (this->use_final_frame_for_exceeded_frame_ == true) {
        this->remained_num_samples_ = 1;
      }
    }
    else {
      iVar5 = this->point_index_in_frame_ + 1;
      this->point_index_in_frame_ = iVar5;
      if (iVar5 % this->frame_period_ == 0) {
        pdVar2 = (this->next_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar6 = (long)(this->next_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_finish - (long)pdVar2;
        if (sVar6 != 0) {
          memmove((this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,pdVar2,sVar6);
        }
        iVar5 = (*this->source_->_vptr_InputSourceInterface[4])(this->source_,&this->next_data_);
        if ((char)iVar5 == '\0') {
          pdVar2 = (this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar5 = 1;
          sVar6 = (long)(this->curr_data_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2;
          if (sVar6 != 0) {
            memmove((this->next_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,pdVar2,sVar6);
          }
        }
        else {
          iVar5 = this->frame_period_ + 1;
        }
        this->remained_num_samples_ = iVar5;
        if (0 < this->interpolation_period_) {
          CalculateIncrement(this);
        }
        this->point_index_in_frame_ = 0;
        bVar7 = true;
      }
      else {
        iVar1 = this->interpolation_period_;
        if (iVar1 < 1) {
          bVar7 = true;
          if (this->frame_period_ / 2 == iVar5 && iVar1 == 0) {
            pdVar2 = (this->next_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sVar6 = (long)(this->next_data_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2;
            if (sVar6 != 0) {
              memmove((this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start,pdVar2,sVar6);
            }
          }
        }
        else {
          bVar7 = true;
          if ((iVar5 + this->first_interpolation_period_) % iVar1 == 0) {
            pdVar2 = (this->increment_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar3 = (this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar8 = 0;
            uVar4 = (ulong)(uint)this->data_length_;
            if (this->data_length_ < 1) {
              uVar4 = uVar8;
            }
            for (; uVar4 != uVar8; uVar8 = uVar8 + 1) {
              dVar9 = pdVar2[uVar8];
              if ((dVar9 != 1.79769313486232e+308) || (NAN(dVar9))) {
                dVar9 = dVar9 + pdVar3[uVar8];
              }
              else {
                dVar9 = this->magic_number_;
              }
              pdVar3[uVar8] = dVar9;
            }
          }
        }
      }
    }
  }
  return bVar7;
}

Assistant:

bool InputSourceInterpolationWithMagicNumber::Get(std::vector<double>* buffer) {
  if (NULL == buffer || !is_valid_) {
    return false;
  }

  if (remained_num_samples_ <= 0) {
    return false;
  }

  if (buffer->size() != static_cast<std::size_t>(data_length_)) {
    buffer->resize(data_length_);
  }

  std::copy(curr_data_.begin(), curr_data_.end(), buffer->begin());

  --remained_num_samples_;

  if (remained_num_samples_ <= 0) {
    if (use_final_frame_for_exceeded_frame_) {
      remained_num_samples_ = 1;
    }
    return true;
  }

  // Update internal states for the next call.
  ++point_index_in_frame_;

  if (0 == point_index_in_frame_ % frame_period_) {
    // Update current and next data.
    std::copy(next_data_.begin(), next_data_.end(), curr_data_.begin());
    if (!source_->Get(&next_data_)) {
      // Use the final data until the end of input sequence.
      std::copy(curr_data_.begin(), curr_data_.end(), next_data_.begin());
      remained_num_samples_ = 1;
    } else {
      remained_num_samples_ = frame_period_ + 1;
    }

    if (0 < interpolation_period_) {
      CalculateIncrement();
    }

    // Rewind point index.
    point_index_in_frame_ = 0;
  } else if (0 < interpolation_period_ &&
             0 == ((point_index_in_frame_ + first_interpolation_period_) %
                   interpolation_period_)) {
    // Interpolate adjacent data without magic number.
    for (int i(0); i < data_length_; ++i) {
      if (kCannotCalculateIncrements == increment_[i]) {
        curr_data_[i] = magic_number_;
      } else {
        curr_data_[i] += increment_[i];
      }
    }
  } else if (0 == interpolation_period_ &&
             frame_period_ / 2 == point_index_in_frame_) {
    std::copy(next_data_.begin(), next_data_.end(), curr_data_.begin());
  }

  return true;
}